

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageCopyMergeGray
               (gdImagePtr dst,gdImagePtr src,int dstX,int dstY,int srcX,int srcY,int w,int h,
               int pct)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int x;
  uint uVar8;
  uint uVar9;
  int r;
  int b;
  int g;
  int x_00;
  
  iVar6 = h + srcY;
  fVar2 = (float)pct / 100.0;
  for (; x_00 = dstX, x = srcX, srcY < iVar6; srcY = srcY + 1) {
    for (; x < w + srcX; x = x + 1) {
      uVar3 = gdImageGetPixel(src,x,srcY);
      if (src->transparent != uVar3) {
        if (pct + -100 != 0 || dst != src) {
          uVar4 = gdImageGetPixel(dst,x_00,dstY);
          if (dst->trueColor == 0) {
            uVar8 = dst->red[(int)uVar4];
            uVar9 = dst->green[(int)uVar4];
          }
          else {
            uVar8 = uVar4 >> 0x10 & 0xff;
            uVar9 = uVar4 >> 8 & 0xff;
          }
          if (dst->trueColor == 0) {
            uVar4 = dst->blue[(int)uVar4];
          }
          else {
            uVar4 = uVar4 & 0xff;
          }
          if (src->trueColor == 0) {
            uVar5 = src->red[(int)uVar3];
            uVar7 = src->green[(int)uVar3];
            uVar3 = src->blue[(int)uVar3];
          }
          else {
            uVar5 = uVar3 >> 0x10 & 0xff;
            uVar7 = uVar3 >> 8 & 0xff;
            uVar3 = uVar3 & 0xff;
          }
          fVar1 = ((float)(int)uVar4 * 0.114 + (float)(int)uVar8 * 0.299 + (float)(int)uVar9 * 0.587
                  ) * ((float)-(pct + -100) / 100.0);
          r = (int)((float)(int)uVar5 * fVar2 + fVar1);
          g = (int)((float)(int)uVar7 * fVar2 + fVar1);
          b = (int)((float)(int)uVar3 * fVar2 + fVar1);
          uVar3 = gdImageColorExact(dst,r,g,b);
          if ((uVar3 == 0xffffffff) &&
             (uVar3 = gdImageColorAllocate(dst,r,g,b), uVar3 == 0xffffffff)) {
            uVar3 = gdImageColorClosest(dst,r,g,b);
          }
        }
        gdImageSetPixel(dst,x_00,dstY,uVar3);
      }
      x_00 = x_00 + 1;
    }
    dstY = dstY + 1;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageCopyMergeGray (gdImagePtr dst, gdImagePtr src, int dstX, int dstY,
										int srcX, int srcY, int w, int h, int pct)
{

	int c, dc;
	int x, y;
	int tox, toy;
	int ncR, ncG, ncB;
	float g;
	toy = dstY;
	for (y = srcY; (y < (srcY + h)); y++) {
		tox = dstX;
		for (x = srcX; (x < (srcX + w)); x++) {
			int nc;
			c = gdImageGetPixel (src, x, y);
			/* Added 7/24/95: support transparent copies */
			if (gdImageGetTransparent (src) == c) {
				tox++;
				continue;
			}
			/*
			 * If it's the same image, mapping is NOT trivial since we
			 * merge with greyscale target, but if pct is 100, the grey
			 * value is not used, so it becomes trivial. pjw 2.0.12.
			 */
			if (dst == src && pct == 100) {
				nc = c;
			} else {
				dc = gdImageGetPixel (dst, tox, toy);
				g = 0.29900 * gdImageRed(dst, dc)
				    + 0.58700 * gdImageGreen(dst, dc) + 0.11400 * gdImageBlue(dst, dc);

				ncR = gdImageRed (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);
				ncG = gdImageGreen (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);
				ncB = gdImageBlue (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);

				/* First look for an exact match */
				nc = gdImageColorExact (dst, ncR, ncG, ncB);
				if (nc == (-1)) {
					/* No, so try to allocate it */
					nc = gdImageColorAllocate (dst, ncR, ncG, ncB);
					/* If we're out of colors, go for the
					   closest color */
					if (nc == (-1)) {
						nc = gdImageColorClosest (dst, ncR, ncG, ncB);
					}
				}
			}
			gdImageSetPixel (dst, tox, toy, nc);
			tox++;
		}
		toy++;
	}
}